

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

SquareMatrix<double,_3> * OpenMD::SquareMatrix<double,_3>::identity(void)

{
  double *pdVar1;
  RectMatrix<double,_3U,_3U> *in_RDI;
  uint j;
  uint i;
  SquareMatrix<double,_3> *m;
  SquareMatrix<double,_3> *in_stack_ffffffffffffffc0;
  undefined4 local_14;
  undefined4 local_10;
  
  SquareMatrix(in_stack_ffffffffffffffc0);
  for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
    for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
      if (local_10 == local_14) {
        pdVar1 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,local_10,local_14);
        *pdVar1 = 1.0;
      }
      else {
        pdVar1 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,local_10,local_14);
        *pdVar1 = 0.0;
      }
    }
  }
  return (SquareMatrix<double,_3> *)in_RDI;
}

Assistant:

static SquareMatrix<Real, Dim> identity() {
      SquareMatrix<Real, Dim> m;

      for (unsigned int i = 0; i < Dim; i++)
        for (unsigned int j = 0; j < Dim; j++)
          if (i == j)
            m(i, j) = 1.0;
          else
            m(i, j) = 0.0;

      return m;
    }